

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobjectbuilder.cpp
# Opt level: O2

int __thiscall QMetaObjectBuilder::indexOfEnumerator(QMetaObjectBuilder *this,QByteArray *name)

{
  pointer pQVar1;
  bool bVar2;
  reference pvVar3;
  pointer rhs;
  long lVar4;
  
  rhs = (this->d->enumerators).
        super__Vector_base<QMetaEnumBuilderPrivate,_std::allocator<QMetaEnumBuilderPrivate>_>.
        _M_impl.super__Vector_impl_data._M_start;
  pQVar1 = (this->d->enumerators).
           super__Vector_base<QMetaEnumBuilderPrivate,_std::allocator<QMetaEnumBuilderPrivate>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  lVar4 = -(long)rhs;
  while( true ) {
    if (rhs == pQVar1) {
      return -1;
    }
    bVar2 = ::operator==(name,&rhs->name);
    if (bVar2) break;
    rhs = rhs + 1;
    lVar4 = lVar4 + -0x70;
  }
  pvVar3 = std::vector<QMetaEnumBuilderPrivate,_std::allocator<QMetaEnumBuilderPrivate>_>::front
                     (&this->d->enumerators);
  return (int)(-((long)&(pvVar3->name).d.d + lVar4) / 0x70);
}

Assistant:

int QMetaObjectBuilder::indexOfEnumerator(const QByteArray &name)
{
    for (const auto &enumerator : d->enumerators) {
        if (name == enumerator.name)
            return int(&enumerator - &d->enumerators.front());
    }
    return -1;
}